

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depth_to_bgr.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  long lVar2;
  initializer_list<cv::Mat> __l;
  string data_dir;
  vector<cv::Mat,_std::allocator<cv::Mat>_> images;
  Mat viz;
  Mat depth_normalized;
  Mat depth_bgr;
  Mat depth;
  Mat bgr;
  long *local_678 [2];
  long local_668 [2];
  void *local_658;
  undefined8 uStack_650;
  long local_648;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  long *local_578;
  long local_570;
  long local_568 [2];
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_558;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_540;
  long *local_528;
  _InputArray *local_520;
  long alStack_518 [10];
  Mat local_4c8 [16];
  Mat local_4b8 [80];
  Mat local_468 [16];
  Mat local_458 [144];
  Vec2i local_3c8;
  _InputArray local_3c0 [4];
  _InputArray local_360;
  _InputArray local_348 [4];
  _InputArray local_2e8 [4];
  string local_288 [96];
  Mat local_228 [96];
  Mat local_1c8 [96];
  Mat local_168 [96];
  Mat local_108 [96];
  Mat local_a8 [96];
  Scalar local_48;
  
  if (argc != 2) {
    __assert_fail("argc == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/wkentaro[P]imgviz-cpp/examples/depth_to_bgr.cpp"
                  ,4,"int main(int, char **)");
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_578,argv[1],(allocator<char> *)&local_528);
  local_528 = alStack_518;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_528,local_578,local_570 + (long)local_578);
  std::__cxx11::string::append((char *)&local_528);
  cv::imread(local_288,(int)&local_528);
  if (local_528 != alStack_518) {
    operator_delete(local_528,alStack_518[0] + 1);
  }
  local_528 = alStack_518;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_528,local_578,local_570 + (long)local_578);
  std::__cxx11::string::append((char *)&local_528);
  cv::imread((string *)local_2e8,(int)&local_528);
  if (local_528 != alStack_518) {
    operator_delete(local_528,alStack_518[0] + 1);
  }
  if ((local_2e8[0].flags & 0xfffU) == 2) {
    alStack_518[0] = 0;
    local_528._0_4_ = 0x2010000;
    local_520 = local_2e8;
    cv::Mat::convertTo((_OutputArray *)local_2e8,(int)&local_528,1.0,0.0);
    local_678[0] = (long *)0x7ff8000000000000;
    local_3c0[0].flags = -0x3efdfffa;
    local_3c0[0].sz.width = 1;
    local_3c0[0].sz.height = 1;
    local_3c0[0].obj = local_678;
    cv::operator==((Mat *)&local_528,0.0);
    cv::_InputArray::_InputArray(local_348,(MatExpr *)&local_528);
    cv::Mat::setTo(local_2e8,local_3c0);
    cv::Mat::~Mat(local_458);
    cv::Mat::~Mat(local_4b8);
    cv::Mat::~Mat((Mat *)alStack_518);
    alStack_518[0] = 0;
    local_528._0_4_ = 0x2010000;
    local_520 = local_2e8;
    cv::Mat::convertTo((_OutputArray *)local_2e8,(int)&local_528,0.001,0.0);
    cv::Mat::Mat(local_a8,(Mat *)local_2e8);
    imgviz::normalize((imgviz *)local_3c0,local_a8,0.3,1.0);
    cv::Mat::~Mat(local_a8);
    alStack_518[0] = 0;
    local_528._0_4_ = 0x2010000;
    local_520 = local_3c0;
    cv::Mat::convertTo((_OutputArray *)local_3c0,(int)&local_528,255.0,0.0);
    alStack_518[0] = 0;
    local_528 = (long *)CONCAT44(local_528._4_4_,0x2010000);
    local_520 = local_3c0;
    cv::Mat::convertTo((_OutputArray *)local_3c0,(int)&local_528,1.0,0.0);
    cv::Mat::Mat(local_108,(Mat *)local_2e8);
    imgviz::depthToBgr((imgviz *)local_348,local_108,0.3,1.0);
    cv::Mat::~Mat(local_108);
    cv::Mat::Mat(local_168,(Mat *)local_288);
    local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"bgr","");
    local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"lt+","");
    imgviz::textInRectangle((imgviz *)&local_528,local_168,&local_598,&local_5b8,0,1.0,2);
    cv::Mat::operator=((Mat *)local_288,(Mat *)&local_528);
    cv::Mat::~Mat((Mat *)&local_528);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
      operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_598._M_dataplus._M_p != &local_598.field_2) {
      operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
    }
    cv::Mat::~Mat(local_168);
    cv::Mat::Mat(local_1c8,(Mat *)local_3c0);
    local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d8,"depth_normalized","");
    local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"lt+","");
    imgviz::textInRectangle((imgviz *)&local_528,local_1c8,&local_5d8,&local_5f8,0,1.0,2);
    cv::Mat::operator=((Mat *)local_3c0,(Mat *)&local_528);
    cv::Mat::~Mat((Mat *)&local_528);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
      operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
      operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
    }
    cv::Mat::~Mat(local_1c8);
    cv::Mat::Mat(local_228,(Mat *)local_348);
    local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_618,"depth_bgr","");
    local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_638,"lt+","");
    imgviz::textInRectangle((imgviz *)&local_528,local_228,&local_618,&local_638,0,1.0,2);
    cv::Mat::operator=((Mat *)local_348,(Mat *)&local_528);
    cv::Mat::~Mat((Mat *)&local_528);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_638._M_dataplus._M_p != &local_638.field_2) {
      operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_618._M_dataplus._M_p != &local_618.field_2) {
      operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
    }
    cv::Mat::~Mat(local_228);
    cv::Mat::Mat((Mat *)&local_528,(Mat *)local_288);
    cv::Mat::Mat(local_4c8,(Mat *)local_3c0);
    cv::Mat::Mat(local_468,(Mat *)local_348);
    __l._M_len = 3;
    __l._M_array = (iterator)&local_528;
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
              (&local_540,__l,(allocator_type *)local_678);
    lVar2 = 0xc0;
    do {
      cv::Mat::~Mat((Mat *)((long)&local_528 + lVar2));
      lVar2 = lVar2 + -0x60;
    } while (lVar2 != -0x60);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector(&local_558,&local_540);
    local_3c8.super_Matx<int,_2,_1>.val = (Matx<int,_2,_1>)(int  [2])0x300000001;
    local_48.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = 255.0;
    local_48.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = 255.0;
    local_48.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 255.0;
    local_48.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
    imgviz::tile((imgviz *)&local_528,&local_558,&local_3c8,5,&local_48);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_558);
    local_678[0] = local_668;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_678,"depth_to_bgr.png","");
    local_360.sz.width = 0;
    local_360.sz.height = 0;
    local_360.flags = 0x1010000;
    local_648 = 0;
    local_658 = (void *)0x0;
    uStack_650 = 0;
    local_360.obj = (imgviz *)&local_528;
    cv::imwrite((string *)local_678,&local_360,(vector *)&local_658);
    if (local_658 != (void *)0x0) {
      operator_delete(local_658,local_648 - (long)local_658);
    }
    if (local_678[0] != local_668) {
      operator_delete(local_678[0],local_668[0] + 1);
    }
    pcVar1 = getenv("CI");
    if (pcVar1 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_678,*argv,(allocator<char> *)&local_658);
      local_360.sz.width = 0;
      local_360.sz.height = 0;
      local_360.flags = 0x1010000;
      local_360.obj = (imgviz *)&local_528;
      cv::imshow((string *)local_678,&local_360);
      if (local_678[0] != local_668) {
        operator_delete(local_678[0],local_668[0] + 1);
      }
      cv::waitKey(0);
    }
    cv::Mat::~Mat((Mat *)&local_528);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_540);
    cv::Mat::~Mat((Mat *)local_348);
    cv::Mat::~Mat((Mat *)local_3c0);
    cv::Mat::~Mat((Mat *)local_2e8);
    cv::Mat::~Mat((Mat *)local_288);
    if (local_578 != local_568) {
      operator_delete(local_578,local_568[0] + 1);
    }
    return 0;
  }
  __assert_fail("depth.type() == CV_16UC1",
                "/workspace/llm4binary/github/license_c_cmakelists/wkentaro[P]imgviz-cpp/examples/depth_to_bgr.cpp"
                ,9,"int main(int, char **)");
}

Assistant:

int main(int argc, char **argv) {
  assert(argc == 2);

  std::string data_dir = std::string(argv[1]);
  cv::Mat bgr = cv::imread(data_dir + "/rgb.png");
  cv::Mat depth = cv::imread(data_dir + "/depth.png", -1);
  assert(depth.type() == CV_16UC1);
  depth.convertTo(depth, CV_32FC1);
  depth.setTo(NAN, depth == 0);
  depth /= 1000;

  cv::Mat depth_normalized =
      imgviz::normalize(depth, /*min_val=*/0.3, /*max_val=*/1);
  depth_normalized *= 255;
  depth_normalized.convertTo(depth_normalized, CV_8UC1);

  cv::Mat depth_bgr = imgviz::depthToBgr(depth, /*min_val=*/0.3, /*max_val=*/1);

  bgr = imgviz::textInRectangle(bgr, "bgr");
  depth_normalized =
      imgviz::textInRectangle(depth_normalized, "depth_normalized");
  depth_bgr = imgviz::textInRectangle(depth_bgr, "depth_bgr");

  std::vector<cv::Mat> images = {bgr, depth_normalized, depth_bgr};
  cv::Mat viz = imgviz::tile(images, /*shape=*/cv::Vec2i(1, 3));

  cv::imwrite("depth_to_bgr.png", viz);
  if (!std::getenv("CI")) {
    cv::imshow(argv[0], viz);
    cv::waitKey(0);
  }
}